

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Comment_PDU::SetFixedDatum
          (Comment_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
          *FD)

{
  KUINT16 *pKVar1;
  KUINT32 KVar2;
  
  pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 - (short)(this->m_ui32NumFixedDatum << 3);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  ::operator=(&this->m_vFixedDatum,FD);
  KVar2 = (KUINT32)(((long)(this->m_vFixedDatum).
                           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_vFixedDatum).
                          super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  this->m_ui32NumFixedDatum = KVar2;
  pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)(KVar2 << 3);
  return;
}

Assistant:

void Comment_PDU::SetFixedDatum( const vector<FixDtmPtr> & FD )
{
    // Subtract old length
    m_ui16PDULength -= m_ui32NumFixedDatum * FixedDatum::FIXED_DATUM_SIZE;

    m_vFixedDatum = FD;
    m_ui32NumFixedDatum = m_vFixedDatum.size();

    // Calculate new length
    m_ui16PDULength += m_ui32NumFixedDatum * FixedDatum::FIXED_DATUM_SIZE;
}